

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_file.c
# Opt level: O2

ion_file_offset_t ion_fend(ion_file_handle_t file)

{
  long seek_to;
  long lVar1;
  
  seek_to = ftell((FILE *)file);
  ion_fseek(file,0,2);
  lVar1 = ftell((FILE *)file);
  ion_fseek(file,seek_to,0);
  return lVar1;
}

Assistant:

ion_file_offset_t
ion_fend(
	ion_file_handle_t file
) {
	ion_file_offset_t	previous;
	ion_file_offset_t	to_return;

	previous	= ion_ftell(file);
	ion_fseek(file, 0, ION_FILE_END);
	to_return	= ion_ftell(file);
	ion_fseek(file, previous, ION_FILE_START);

	return to_return;
}